

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cc
# Opt level: O0

void __thiscall HighVariable::printInfo(HighVariable *this,ostream *s)

{
  bool bVar1;
  int2 iVar2;
  ostream *poVar3;
  string *psVar4;
  reference ppVVar5;
  void *this_00;
  __normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_> local_38;
  Varnode **local_30;
  Varnode *local_28;
  Varnode *vn;
  const_iterator viter;
  ostream *s_local;
  HighVariable *this_local;
  
  viter._M_current = (Varnode **)s;
  __gnu_cxx::
  __normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>::
  __normal_iterator((__normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>
                     *)&vn);
  updateType(this);
  if (this->symbol == (Symbol *)0x0) {
    poVar3 = std::operator<<((ostream *)viter._M_current,"Variable: UNNAMED");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<((ostream *)viter._M_current,"Variable: ");
    psVar4 = Symbol::getName_abi_cxx11_(this->symbol);
    std::operator<<(poVar3,(string *)psVar4);
    if (this->symboloffset != -1) {
      std::operator<<((ostream *)viter._M_current,"(partial)");
    }
    std::ostream::operator<<(viter._M_current,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)viter._M_current,"Type: ");
  (*this->type->_vptr_Datatype[3])(this->type,viter._M_current);
  std::operator<<((ostream *)viter._M_current,"\n\n");
  local_30 = (Varnode **)std::vector<Varnode_*,_std::allocator<Varnode_*>_>::begin(&this->inst);
  vn = (Varnode *)local_30;
  while( true ) {
    local_38._M_current =
         (Varnode **)std::vector<Varnode_*,_std::allocator<Varnode_*>_>::end(&this->inst);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>
                        *)&vn,&local_38);
    if (!bVar1) break;
    ppVVar5 = __gnu_cxx::
              __normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>
              ::operator*((__normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>
                           *)&vn);
    local_28 = *ppVVar5;
    this_00 = (void *)std::ostream::operator<<(viter._M_current,std::dec);
    iVar2 = Varnode::getMergeGroup(local_28);
    poVar3 = (ostream *)std::ostream::operator<<(this_00,iVar2);
    std::operator<<(poVar3,": ");
    Varnode::printInfo(local_28,(ostream *)viter._M_current);
    __gnu_cxx::
    __normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>::
    operator++((__normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>
                *)&vn);
  }
  return;
}

Assistant:

void HighVariable::printInfo(ostream &s) const

{
  vector<Varnode *>::const_iterator viter;
  Varnode *vn;

  updateType();
  if (symbol == (Symbol *)0) {
    s << "Variable: UNNAMED" << endl;
  }
  else {
    s << "Variable: " << symbol->getName();
    if (symboloffset!=-1)
      s << "(partial)";
    s << endl;
  }
  s << "Type: ";
  type->printRaw(s);
  s << "\n\n";
				
  for(viter=inst.begin();viter!=inst.end();++viter) {
    vn = *viter;
    s << dec << vn->getMergeGroup() << ": ";
    vn->printInfo(s);
  }
}